

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void destroyBindings(BINDING *bindings,XML_Parser parser)

{
  binding *pbVar1;
  
  while (bindings != (BINDING *)0x0) {
    pbVar1 = bindings->nextTagBinding;
    (**(code **)((long)parser + 0x28))(bindings->uri);
    (**(code **)((long)parser + 0x28))(bindings);
    bindings = pbVar1;
  }
  return;
}

Assistant:

static
void destroyBindings(BINDING *bindings, XML_Parser parser)
{
  for (;;) {
    BINDING *b = bindings;
    if (!b)
      break;
    bindings = b->nextTagBinding;
    FREE(b->uri);
    FREE(b);
  }
}